

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionFreeStr.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionFreeStr::write_cpp_code_seq
          (InstructionFreeStr *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter,
          string *repl_data,string *repl_buf)

{
  bool bVar1;
  StreamSep *pSVar2;
  StreamSep local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string *var;
  iterator __end2;
  iterator __begin2;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__range2;
  string *repl_buf_local;
  string *repl_data_local;
  CppEmitter *cpp_emitter_local;
  StreamSepMaker *es_local;
  StreamSepMaker *ss_local;
  InstructionFreeStr *this_local;
  
  bVar1 = CppEmitter::need_buf(cpp_emitter);
  if ((bVar1) && (bVar1 = CppEmitter::interruptible(cpp_emitter), bVar1)) {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&(this->strs).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
    var = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&(this->strs).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&var), bVar1) {
      local_58 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      StreamSepMaker::operator<<
                (&local_a0,ss,(char (*) [39])"HPIPE_BUFF_T::skip( &HPIPE_DATA.__beg_");
      pSVar2 = StreamSep::operator<<(&local_a0,local_58);
      pSVar2 = StreamSep::operator<<(pSVar2,(char (*) [24])"_buf, HPIPE_DATA.__beg_");
      pSVar2 = StreamSep::operator<<(pSVar2,local_58);
      pSVar2 = StreamSep::operator<<
                         (pSVar2,(char (*) [53])
                                 "_data, HPIPE_BUFF_T::size_between( HPIPE_DATA.__beg_");
      pSVar2 = StreamSep::operator<<(pSVar2,local_58);
      pSVar2 = StreamSep::operator<<(pSVar2,(char (*) [24])"_buf, HPIPE_DATA.__beg_");
      pSVar2 = StreamSep::operator<<(pSVar2,local_58);
      pSVar2 = StreamSep::operator<<(pSVar2,(char (*) [8])0x24bc3b);
      pSVar2 = StreamSep::operator<<(pSVar2,repl_buf);
      pSVar2 = StreamSep::operator<<(pSVar2,(char (*) [3])0x24b8a5);
      pSVar2 = StreamSep::operator<<(pSVar2,repl_data);
      StreamSep::operator<<(pSVar2,(char (*) [6])" ) );");
      StreamSep::~StreamSep(&local_a0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void InstructionFreeStr::write_cpp_code_seq( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter, std::string repl_data, std::string repl_buf ) {
    if ( cpp_emitter->need_buf() && cpp_emitter->interruptible() )
        for( const std::string &var : strs )
            ss << "HPIPE_BUFF_T::skip( &HPIPE_DATA.__beg_" << var << "_buf, HPIPE_DATA.__beg_" << var << "_data, HPIPE_BUFF_T::size_between( HPIPE_DATA.__beg_" << var << "_buf, HPIPE_DATA.__beg_" << var << "_data, " << repl_buf << ", " << repl_data << " ) );";
}